

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_ClippingRegion::SetObjectToClipTransformation(ON_ClippingRegion *this,ON_Viewport *viewport)

{
  bool bVar1;
  ON_Viewport *viewport_local;
  ON_ClippingRegion *this_local;
  
  bVar1 = ON_Viewport::GetXform(viewport,world_cs,clip_cs,&this->m_xform);
  if (bVar1) {
    bVar1 = ON_Viewport::GetXform(viewport,clip_cs,world_cs,&this->m_inverse_xform);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      memcpy(&this->m_inverse_xform,&ON_Xform::ZeroTransformation,0x80);
      this_local._7_1_ = false;
    }
  }
  else {
    memcpy(this,&ON_Xform::IdentityTransformation,0x80);
    memcpy(&this->m_inverse_xform,&ON_Xform::IdentityTransformation,0x80);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ClippingRegion::SetObjectToClipTransformation(
  const ON_Viewport& viewport
  )
{
  if (false == viewport.GetXform(
    ON::coordinate_system::world_cs,
    ON::coordinate_system::clip_cs,
    m_xform
    ))
  {
    m_xform = ON_Xform::IdentityTransformation;
    m_inverse_xform = ON_Xform::IdentityTransformation;
    return false;
  }

  if (false == viewport.GetXform(
    ON::coordinate_system::clip_cs,
    ON::coordinate_system::world_cs,
    m_inverse_xform
    ))
  {
    m_inverse_xform = ON_Xform::ZeroTransformation;
    return false;
  }

  return true;
}